

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceVkImpl::RenderDeviceVkImpl
          (RenderDeviceVkImpl *this,IReferenceCounters *pRefCounters,
          IMemoryAllocator *RawMemAllocator,IEngineFactory *pEngineFactory,
          EngineVkCreateInfo *EngineCI,GraphicsAdapterInfo *AdapterInfo,size_t CommandQueueCount,
          ICommandQueueVk **CmdQueues,shared_ptr<VulkanUtilities::VulkanInstance> *Instance,
          unique_ptr<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
          *PhysicalDevice,shared_ptr<VulkanUtilities::VulkanLogicalDevice> *LogicalDevice)

{
  initializer_list<VkDescriptorPoolSize> __l;
  initializer_list<VkDescriptorPoolSize> __l_00;
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  *pRVar1;
  MeshShaderProperties *pMVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  element_type *peVar6;
  type PhysicalDevice_00;
  IMemoryAllocator *pIVar7;
  pointer pVVar8;
  ExtensionFeatures *pEVar9;
  VkPhysicalDeviceFeatures *vkFeatures;
  VkPhysicalDeviceProperties *vkDeviceProps;
  ExtensionProperties *ExtProps;
  ICommandQueueVk *pIVar10;
  size_type sVar11;
  reference pvVar12;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false,_false>,_bool>
  pVar13;
  uint local_2c8;
  IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag> local_2c1;
  Uint32 fmt;
  unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_> local_2b8;
  _Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
  local_2b0;
  undefined1 local_2a8;
  allocator local_299;
  CreateInfo local_298;
  _Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
  local_268;
  _Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
  local_260;
  SoftwareQueueIndex local_256;
  IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag> local_255;
  uint local_254;
  undefined4 uStack_250;
  HardwareQueueIndex QueueFamilyIndex;
  Uint32 q;
  Version local_244;
  Version local_23c;
  Version local_234;
  DeviceFeatures local_22b;
  Version local_1fc;
  uint32_t local_1f4;
  undefined1 local_1f0 [4];
  uint32_t vkVersion;
  undefined1 local_1e8 [16];
  string local_1d8;
  allocator<VkDescriptorPoolSize> local_1b1;
  VkDescriptorPoolSize local_1b0;
  Char local_1a8 [4];
  SHADER_TYPE local_1a4;
  Char local_1a0 [4];
  WAVE_FEATURE local_19c;
  Char local_198 [4];
  Uint32 local_194;
  Char local_190 [4];
  Uint32 local_18c;
  Char local_188 [4];
  Uint32 local_184;
  Char local_180 [4];
  Uint32 local_17c;
  Char local_178 [4];
  Uint32 local_174;
  Char local_170 [4];
  Uint32 local_16c;
  Char local_168 [4];
  Uint32 local_164;
  Char local_160 [4];
  Uint32 local_15c;
  Char local_158 [8];
  iterator local_150;
  size_type local_148;
  vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> local_140;
  allocator local_121;
  string local_120;
  allocator<VkDescriptorPoolSize> local_f9;
  VkDescriptorPoolSize local_f8;
  Uint32 local_f0;
  Uint32 local_ec;
  Uint32 local_e8;
  Uint32 local_e4;
  Uint32 local_e0;
  Uint32 local_dc;
  Uint32 local_d8;
  SHADER_TYPE local_d4;
  WAVE_FEATURE local_d0;
  SHADER_TYPE local_cc;
  WAVE_FEATURE local_c8;
  Uint32 local_c4;
  Uint32 local_c0;
  Uint32 local_bc;
  Uint32 local_b8;
  Uint32 local_b4;
  Uint32 local_b0;
  Uint32 local_ac;
  Uint32 local_a8;
  Uint32 local_a4;
  Uint32 local_a0;
  Uint32 local_9c;
  iterator local_98;
  size_type local_90;
  vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> local_88;
  allocator local_59;
  string local_58;
  GraphicsAdapterInfo *local_38;
  GraphicsAdapterInfo *AdapterInfo_local;
  EngineVkCreateInfo *EngineCI_local;
  IEngineFactory *pEngineFactory_local;
  IMemoryAllocator *RawMemAllocator_local;
  IReferenceCounters *pRefCounters_local;
  RenderDeviceVkImpl *this_local;
  
  local_38 = AdapterInfo;
  AdapterInfo_local = (GraphicsAdapterInfo *)EngineCI;
  EngineCI_local = (EngineVkCreateInfo *)pEngineFactory;
  pEngineFactory_local = (IEngineFactory *)RawMemAllocator;
  RawMemAllocator_local = (IMemoryAllocator *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ::RenderDeviceNextGenBase
            (&this->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
             ,pRefCounters,RawMemAllocator,pEngineFactory,CommandQueueCount,CmdQueues,
             (EngineCreateInfo *)EngineCI,AdapterInfo);
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.super_ObjectBase<Diligent::IRenderDeviceVk>
  .super_RefCountedObject<Diligent::IRenderDeviceVk>.super_IRenderDeviceVk.super_IRenderDevice.
  super_IObject = (IObject)&PTR_QueryInterface_010d2c88;
  (this->m_Properties).UploadHeapPageSize = (AdapterInfo_local->MeshShader).MaxThreadGroupCountX;
  (this->m_Properties).DynamicHeapPageSize = (AdapterInfo_local->MeshShader).MaxThreadGroupCountZ;
  std::shared_ptr<VulkanUtilities::VulkanInstance>::shared_ptr(&this->m_VulkanInstance,Instance);
  std::
  unique_ptr<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
  ::unique_ptr(&this->m_PhysicalDevice,PhysicalDevice);
  std::shared_ptr<VulkanUtilities::VulkanLogicalDevice>::shared_ptr
            (&this->m_LogicalVkDevice,LogicalDevice);
  std::unique_ptr<Diligent::FramebufferCache,std::default_delete<Diligent::FramebufferCache>>::
  unique_ptr<std::default_delete<Diligent::FramebufferCache>,void>
            ((unique_ptr<Diligent::FramebufferCache,std::default_delete<Diligent::FramebufferCache>>
              *)&this->m_FramebufferCache);
  std::unique_ptr<Diligent::RenderPassCache,std::default_delete<Diligent::RenderPassCache>>::
  unique_ptr<std::default_delete<Diligent::RenderPassCache>,void>
            ((unique_ptr<Diligent::RenderPassCache,std::default_delete<Diligent::RenderPassCache>> *
             )&this->m_ImplicitRenderPassCache);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"Main descriptor pool",&local_59);
  local_f8.type = VK_DESCRIPTOR_TYPE_SAMPLER;
  local_f8.descriptorCount = (AdapterInfo_local->RayTracing).MaxInstancesPerTLAS;
  local_f0 = 1;
  local_ec = (AdapterInfo_local->RayTracing).MaxPrimitivesPerBLAS;
  local_e8 = 2;
  local_e4 = (AdapterInfo_local->RayTracing).MaxGeometriesPerBLAS;
  local_e0 = 3;
  local_dc = (AdapterInfo_local->RayTracing).VertexBufferAlignment;
  local_d8 = 4;
  local_d4 = (AdapterInfo_local->RayTracing).BoxBufferAlignment;
  local_d0 = WAVE_FEATURE_ARITHMETIC|WAVE_FEATURE_BASIC;
  local_cc = (AdapterInfo_local->RayTracing).ScratchBufferAlignment;
  local_c8 = WAVE_FEATURE_ARITHMETIC|WAVE_FEATURE_VOTE;
  local_c4 = (AdapterInfo_local->RayTracing).IndexBufferAlignment;
  local_c0 = 7;
  local_bc = (AdapterInfo_local->RayTracing).TransformBufferAlignment;
  local_b8 = 8;
  local_b4 = (AdapterInfo_local->RayTracing).IndexBufferAlignment;
  local_b0 = 9;
  local_ac = (AdapterInfo_local->RayTracing).TransformBufferAlignment;
  local_a8 = 10;
  local_a4 = (AdapterInfo_local->RayTracing).InstanceBufferAlignment;
  local_a0 = 0x3b9d13f0;
  local_9c = *(Uint32 *)&(AdapterInfo_local->RayTracing).CapFlags;
  local_98 = &local_f8;
  local_90 = 0xc;
  std::allocator<VkDescriptorPoolSize>::allocator(&local_f9);
  __l_00._M_len = local_90;
  __l_00._M_array = local_98;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            (&local_88,__l_00,&local_f9);
  DescriptorSetAllocator::DescriptorSetAllocator
            (&this->m_DescriptorSetAllocator,this,&local_58,&local_88,
             (AdapterInfo_local->RayTracing).MaxRayGenThreads,true);
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::~vector(&local_88);
  std::allocator<VkDescriptorPoolSize>::~allocator(&local_f9);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"Dynamic descriptor pool",&local_121);
  local_1b0.type = VK_DESCRIPTOR_TYPE_SAMPLER;
  local_1b0.descriptorCount = (AdapterInfo_local->WaveOp).MaxSize;
  local_1a8[0] = '\x01';
  local_1a8[1] = '\0';
  local_1a8[2] = '\0';
  local_1a8[3] = '\0';
  local_1a4 = (AdapterInfo_local->WaveOp).SupportedStages;
  local_1a0[0] = '\x02';
  local_1a0[1] = '\0';
  local_1a0[2] = '\0';
  local_1a0[3] = '\0';
  local_19c = (AdapterInfo_local->WaveOp).Features;
  local_198[0] = '\x03';
  local_198[1] = '\0';
  local_198[2] = '\0';
  local_198[3] = '\0';
  local_194 = (AdapterInfo_local->Buffer).ConstantBufferOffsetAlignment;
  local_190[0] = '\x04';
  local_190[1] = '\0';
  local_190[2] = '\0';
  local_190[3] = '\0';
  local_18c = (AdapterInfo_local->Texture).MaxTexture1DArraySlices;
  local_188[0] = '\x05';
  local_188[1] = '\0';
  local_188[2] = '\0';
  local_188[3] = '\0';
  local_184 = (AdapterInfo_local->Texture).MaxTexture2DDimension;
  local_180[0] = '\x06';
  local_180[1] = '\0';
  local_180[2] = '\0';
  local_180[3] = '\0';
  local_17c = (AdapterInfo_local->Buffer).StructuredBufferOffsetAlignment;
  local_178[0] = '\a';
  local_178[1] = '\0';
  local_178[2] = '\0';
  local_178[3] = '\0';
  local_174 = (AdapterInfo_local->Texture).MaxTexture1DDimension;
  local_170[0] = '\b';
  local_170[1] = '\0';
  local_170[2] = '\0';
  local_170[3] = '\0';
  local_16c = (AdapterInfo_local->Buffer).StructuredBufferOffsetAlignment;
  local_168[0] = '\t';
  local_168[1] = '\0';
  local_168[2] = '\0';
  local_168[3] = '\0';
  local_164 = (AdapterInfo_local->Texture).MaxTexture1DDimension;
  local_160[0] = '\n';
  local_160[1] = '\0';
  local_160[2] = '\0';
  local_160[3] = '\0';
  local_15c = (AdapterInfo_local->RayTracing).InstanceBufferAlignment;
  local_158[0] = -0x10;
  local_158[1] = '\x13';
  local_158[2] = -99;
  local_158[3] = ';';
  local_158[4] = (AdapterInfo_local->RayTracing).CapFlags;
  local_158[5] = (AdapterInfo_local->RayTracing).field_0x39;
  local_158[6] = (AdapterInfo_local->RayTracing).field_0x3a;
  local_158[7] = (AdapterInfo_local->RayTracing).field_0x3b;
  local_150 = &local_1b0;
  local_148 = 0xc;
  std::allocator<VkDescriptorPoolSize>::allocator(&local_1b1);
  __l._M_len = local_148;
  __l._M_array = local_150;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            (&local_140,__l,&local_1b1);
  DescriptorPoolManager::DescriptorPoolManager
            (&this->m_DynamicDescriptorPool,this,&local_120,&local_140,
             (AdapterInfo_local->WaveOp).MinSize,false);
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::~vector(&local_140);
  std::allocator<VkDescriptorPoolSize>::~allocator(&local_1b1);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::
  unordered_map<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>_>
  ::unordered_map(&this->m_TransientCmdPoolMgrs);
  std::
  vector<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>,_std::allocator<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>_>_>
  ::vector(&this->m_QueryMgrs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1d8,"Global resource memory manager",(allocator *)(local_1e8 + 0xf));
  peVar6 = std::
           __shared_ptr_access<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->m_LogicalVkDevice);
  PhysicalDevice_00 =
       std::
       unique_ptr<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
       ::operator*(&this->m_PhysicalDevice);
  pIVar7 = GetRawAllocator();
  uVar5._0_1_ = (AdapterInfo_local->Texture).Texture2DMSSupported;
  uVar5._1_1_ = (AdapterInfo_local->Texture).Texture2DMSArraySupported;
  uVar5._2_1_ = (AdapterInfo_local->Texture).TextureViewSupported;
  uVar5._3_1_ = (AdapterInfo_local->Texture).CubemapArraysSupported;
  VulkanUtilities::VulkanMemoryManager::VulkanMemoryManager
            (&this->m_MemoryMgr,&local_1d8,peVar6,PhysicalDevice_00,pIVar7,
             (ulong)(AdapterInfo_local->Texture).MaxTextureCubeDimension,(ulong)uVar5,
             (ulong)*(uint *)&(AdapterInfo_local->Texture).TextureView2DOn3DSupported,
             (ulong)*(uint *)&AdapterInfo_local->Sampler);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)(local_1e8 + 0xf));
  pIVar7 = GetRawAllocator();
  VulkanDynamicMemoryManager::VulkanDynamicMemoryManager
            (&this->m_DynamicMemoryManager,pIVar7,this,
             (AdapterInfo_local->MeshShader).MaxThreadGroupCountY,0xffffffffffffffff);
  pVVar8 = std::
           unique_ptr<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ::operator->(&this->m_PhysicalDevice);
  uVar4 = VulkanUtilities::VulkanPhysicalDevice::GetVkVersion(pVVar8);
  CreateDXCompiler((Diligent *)&this->m_pDxCompiler,Vulkan,uVar4,
                   *(char **)&(AdapterInfo_local->ShadingRate).ShadingRateTextureAccess);
  peVar6 = std::
           __shared_ptr_access<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_LogicalVkDevice);
  pEVar9 = VulkanUtilities::VulkanLogicalDevice::GetEnabledExtFeatures(peVar6);
  if ((pEVar9->DynamicRendering).dynamicRendering == 0) {
    std::make_unique<Diligent::FramebufferCache,Diligent::RenderDeviceVkImpl&>
              ((RenderDeviceVkImpl *)local_1e8);
    std::unique_ptr<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>::
    operator=(&this->m_FramebufferCache,
              (unique_ptr<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>
               *)local_1e8);
    std::unique_ptr<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>::
    ~unique_ptr((unique_ptr<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>
                 *)local_1e8);
    std::make_unique<Diligent::RenderPassCache,Diligent::RenderDeviceVkImpl&>
              ((RenderDeviceVkImpl *)local_1f0);
    std::unique_ptr<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>::
    operator=(&this->m_ImplicitRenderPassCache,
              (unique_ptr<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>
               *)local_1f0);
    std::unique_ptr<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>::
    ~unique_ptr((unique_ptr<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>
                 *)local_1f0);
  }
  pVVar8 = std::
           unique_ptr<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ::operator->(&this->m_PhysicalDevice);
  local_1f4 = VulkanUtilities::VulkanPhysicalDevice::GetVkVersion(pVVar8);
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Type =
       RENDER_DEVICE_TYPE_VULKAN;
  Version::Version(&local_1fc,local_1f4 >> 0x16 & 0x7f,local_1f4 >> 0xc & 0x3ff);
  uVar4 = local_1f4;
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.APIVersion = local_1fc;
  peVar6 = std::
           __shared_ptr_access<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_LogicalVkDevice);
  vkFeatures = VulkanUtilities::VulkanLogicalDevice::GetEnabledFeatures(peVar6);
  pVVar8 = std::
           unique_ptr<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ::operator->(&this->m_PhysicalDevice);
  vkDeviceProps = VulkanUtilities::VulkanPhysicalDevice::GetProperties(pVVar8);
  peVar6 = std::
           __shared_ptr_access<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_LogicalVkDevice);
  pEVar9 = VulkanUtilities::VulkanLogicalDevice::GetEnabledExtFeatures(peVar6);
  pVVar8 = std::
           unique_ptr<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ::operator->(&this->m_PhysicalDevice);
  ExtProps = VulkanUtilities::VulkanPhysicalDevice::GetExtProperties(pVVar8);
  VkFeaturesToDeviceFeatures
            (&local_22b,uVar4,vkFeatures,vkDeviceProps,pEVar9,ExtProps,DEVICE_FEATURE_STATE_ENABLED)
  ;
  pRVar1 = &this->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  UniformBuffer8BitAccess = local_22b.UniformBuffer8BitAccess;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ShaderResourceStaticArrays = local_22b.ShaderResourceStaticArrays;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ShaderResourceRuntimeArrays = local_22b.ShaderResourceRuntimeArrays;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.WaveOp =
       local_22b.WaveOp;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  InstanceDataStepRate = local_22b.InstanceDataStepRate;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.NativeFence =
       local_22b.NativeFence;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.TileShaders =
       local_22b.TileShaders;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TransferQueueTimestampQueries = local_22b.TransferQueueTimestampQueries;
  pRVar1 = &this->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  VariableRateShading = local_22b.VariableRateShading;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  SparseResources = local_22b.SparseResources;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  SubpassFramebufferFetch = local_22b.SubpassFramebufferFetch;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TextureComponentSwizzle = local_22b.TextureComponentSwizzle;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TextureSubresourceViews = local_22b.TextureSubresourceViews;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  NativeMultiDraw = local_22b.NativeMultiDraw;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  AsyncShaderCompilation = local_22b.AsyncShaderCompilation;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  FormattedBuffers = local_22b.FormattedBuffers;
  pRVar1 = &this->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.DepthClamp =
       local_22b.DepthClamp;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  IndependentBlend = local_22b.IndependentBlend;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  DualSourceBlend = local_22b.DualSourceBlend;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.MultiViewport
       = local_22b.MultiViewport;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TextureCompressionBC = local_22b.TextureCompressionBC;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TextureCompressionETC2 = local_22b.TextureCompressionETC2;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  VertexPipelineUAVWritesAndAtomics = local_22b.VertexPipelineUAVWritesAndAtomics;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  PixelUAVWritesAndAtomics = local_22b.PixelUAVWritesAndAtomics;
  pRVar1 = &this->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TextureUAVExtendedFormats = local_22b.TextureUAVExtendedFormats;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.ShaderFloat16
       = local_22b.ShaderFloat16;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ResourceBuffer16BitAccess = local_22b.ResourceBuffer16BitAccess;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  UniformBuffer16BitAccess = local_22b.UniformBuffer16BitAccess;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ShaderInputOutput16 = local_22b.ShaderInputOutput16;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.ShaderInt8 =
       local_22b.ShaderInt8;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ResourceBuffer8BitAccess = local_22b.ResourceBuffer8BitAccess;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  UniformBuffer8BitAccess = local_22b.UniformBuffer8BitAccess;
  pRVar1 = &this->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  SeparablePrograms = local_22b.SeparablePrograms;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ShaderResourceQueries = local_22b.ShaderResourceQueries;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.WireframeFill
       = local_22b.WireframeFill;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  MultithreadedResourceCreation = local_22b.MultithreadedResourceCreation;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ComputeShaders = local_22b.ComputeShaders;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  GeometryShaders = local_22b.GeometryShaders;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.Tessellation
       = local_22b.Tessellation;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.MeshShaders =
       local_22b.MeshShaders;
  pRVar1 = &this->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.RayTracing =
       local_22b.RayTracing;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  BindlessResources = local_22b.BindlessResources;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  OcclusionQueries = local_22b.OcclusionQueries;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  BinaryOcclusionQueries = local_22b.BinaryOcclusionQueries;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TimestampQueries = local_22b.TimestampQueries;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  PipelineStatisticsQueries = local_22b.PipelineStatisticsQueries;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  DurationQueries = local_22b.DurationQueries;
  (pRVar1->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  DepthBiasClamp = local_22b.DepthBiasClamp;
  Version::Version(&local_234,5,1);
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.MaxShaderVersion.HLSL =
       local_234;
  Version::Version(&local_23c,4,6);
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.MaxShaderVersion.GLSL =
       local_23c;
  Version::Version(&local_244,3,2);
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.MaxShaderVersion.GLESSL =
       local_244;
  uStack_250 = 0;
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.NDC.YtoVScale = -0.5;
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.NDC.MinZ = 0.0;
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.NDC.ZtoDepthScale = 1.0;
  std::
  vector<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>,_std::allocator<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>_>_>
  ::reserve(&this->m_QueryMgrs,CommandQueueCount);
  for (local_254 = 0; local_254 < CommandQueueCount; local_254 = local_254 + 1) {
    IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>::
    IndexWrapper<unsigned_int,unsigned_int>
              ((IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag> *)&local_256,local_254)
    ;
    pIVar10 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ::GetCommandQueue(&this->
                                 super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                                ,local_256);
    uVar5 = (*(pIVar10->super_ICommandQueue).super_IObject._vptr_IObject[0xc])();
    IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>::
    IndexWrapper<unsigned_int,unsigned_int>
              ((IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag> *)&local_255,uVar5);
    local_260._M_cur =
         (__node_type *)
         std::
         unordered_map<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>_>
         ::find(&this->m_TransientCmdPoolMgrs,(key_type *)&local_255);
    local_268._M_cur =
         (__node_type *)
         std::
         unordered_map<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>_>
         ::end(&this->m_TransientCmdPoolMgrs);
    bVar3 = std::__detail::operator==(&local_260,&local_268);
    if (bVar3) {
      local_298.LogicalDevice = GetLogicalDevice(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_298.Name,"Transient command buffer pool manager",&local_299);
      local_298.queueFamilyIndex.m_Value = local_255.m_Value;
      local_298.flags = 1;
      pVar13 = std::
               unordered_map<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>,Diligent::CommandPoolManager,Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>::Hasher,std::equal_to<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>>,std::allocator<std::pair<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>const,Diligent::CommandPoolManager>>>
               ::
               emplace<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>const&,Diligent::CommandPoolManager::CreateInfo>
                         ((unordered_map<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>,Diligent::CommandPoolManager,Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>::Hasher,std::equal_to<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>>,std::allocator<std::pair<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>const,Diligent::CommandPoolManager>>>
                           *)&this->m_TransientCmdPoolMgrs,&local_255,&local_298);
      local_2b0._M_cur =
           (__node_type *)
           pVar13.first.
           super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
           ._M_cur;
      local_2a8 = pVar13.second;
      CommandPoolManager::CreateInfo::~CreateInfo(&local_298);
      std::allocator<char>::~allocator((allocator<char> *)&local_299);
    }
    pMVar2 = &AdapterInfo_local->MeshShader;
    _fmt = this;
    IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>::
    IndexWrapper<unsigned_int,unsigned_int>(&local_2c1,local_254);
    std::
    make_unique<Diligent::QueryManagerVk,Diligent::RenderDeviceVkImpl*,unsigned_int_const(&)[6],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>>
              ((RenderDeviceVkImpl **)&local_2b8,(uint (*) [6])&fmt,
               (IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *)
               &pMVar2->MaxThreadGroupTotalCount);
    std::
    vector<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>,std::allocator<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>>>
    ::
    emplace_back<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>>
              ((vector<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>,std::allocator<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>>>
                *)&this->m_QueryMgrs,&local_2b8);
    std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>::
    ~unique_ptr(&local_2b8);
  }
  for (local_2c8 = 1;
      sVar11 = std::
               vector<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
               ::size(&(this->
                       super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                       ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_TextureFormatsInfo),
      local_2c8 < sVar11; local_2c8 = local_2c8 + 1) {
    pvVar12 = std::
              vector<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
              ::operator[](&(this->
                            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                            ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
                            m_TextureFormatsInfo,(ulong)local_2c8);
    (pvVar12->super_TextureFormatInfo).Supported = true;
  }
  RenderDeviceBase<Diligent::EngineVkImplTraits>::InitShaderCompilationThreadPool
            ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this,
             *(IThreadPool **)(AdapterInfo_local->Description + 0x60),
             *(Uint32 *)(AdapterInfo_local->Description + 0x68));
  return;
}

Assistant:

RenderDeviceVkImpl::RenderDeviceVkImpl(IReferenceCounters*                                    pRefCounters,
                                       IMemoryAllocator&                                      RawMemAllocator,
                                       IEngineFactory*                                        pEngineFactory,
                                       const EngineVkCreateInfo&                              EngineCI,
                                       const GraphicsAdapterInfo&                             AdapterInfo,
                                       size_t                                                 CommandQueueCount,
                                       ICommandQueueVk**                                      CmdQueues,
                                       std::shared_ptr<VulkanUtilities::VulkanInstance>       Instance,
                                       std::unique_ptr<VulkanUtilities::VulkanPhysicalDevice> PhysicalDevice,
                                       std::shared_ptr<VulkanUtilities::VulkanLogicalDevice>  LogicalDevice) :
    // clang-format off
    TRenderDeviceBase
    {
        pRefCounters,
        RawMemAllocator,
        pEngineFactory,
        CommandQueueCount,
        CmdQueues,
        EngineCI,
        AdapterInfo
    },
    m_Properties
    {
        EngineCI.UploadHeapPageSize,
        EngineCI.DynamicHeapPageSize
    },
    m_VulkanInstance         {Instance                 },
    m_PhysicalDevice         {std::move(PhysicalDevice)},
    m_LogicalVkDevice        {std::move(LogicalDevice) },
    m_DescriptorSetAllocator
    {
        *this,
        "Main descriptor pool",
        std::vector<VkDescriptorPoolSize>
        {
            {VK_DESCRIPTOR_TYPE_SAMPLER,                    EngineCI.MainDescriptorPoolSize.NumSeparateSamplerDescriptors},
            {VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,     EngineCI.MainDescriptorPoolSize.NumCombinedSamplerDescriptors},
            {VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE,              EngineCI.MainDescriptorPoolSize.NumSampledImageDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,              EngineCI.MainDescriptorPoolSize.NumStorageImageDescriptors},
            {VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER,       EngineCI.MainDescriptorPoolSize.NumUniformTexelBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,       EngineCI.MainDescriptorPoolSize.NumStorageTexelBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,             EngineCI.MainDescriptorPoolSize.NumUniformBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,             EngineCI.MainDescriptorPoolSize.NumStorageBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC,     EngineCI.MainDescriptorPoolSize.NumUniformBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC,     EngineCI.MainDescriptorPoolSize.NumStorageBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT,           EngineCI.MainDescriptorPoolSize.NumInputAttachmentDescriptors},
            {VK_DESCRIPTOR_TYPE_ACCELERATION_STRUCTURE_KHR, EngineCI.MainDescriptorPoolSize.NumAccelStructDescriptors}
        },
        EngineCI.MainDescriptorPoolSize.MaxDescriptorSets,
        true
    },
    m_DynamicDescriptorPool
    {
        *this,
        "Dynamic descriptor pool",
        std::vector<VkDescriptorPoolSize>
        {
            {VK_DESCRIPTOR_TYPE_SAMPLER,                    EngineCI.DynamicDescriptorPoolSize.NumSeparateSamplerDescriptors},
            {VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,     EngineCI.DynamicDescriptorPoolSize.NumCombinedSamplerDescriptors},
            {VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE,              EngineCI.DynamicDescriptorPoolSize.NumSampledImageDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,              EngineCI.DynamicDescriptorPoolSize.NumStorageImageDescriptors},
            {VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER,       EngineCI.DynamicDescriptorPoolSize.NumUniformTexelBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,       EngineCI.DynamicDescriptorPoolSize.NumStorageTexelBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,             EngineCI.DynamicDescriptorPoolSize.NumUniformBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,             EngineCI.DynamicDescriptorPoolSize.NumStorageBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC,     EngineCI.DynamicDescriptorPoolSize.NumUniformBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC,     EngineCI.DynamicDescriptorPoolSize.NumStorageBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT,           EngineCI.MainDescriptorPoolSize.NumInputAttachmentDescriptors},
            {VK_DESCRIPTOR_TYPE_ACCELERATION_STRUCTURE_KHR, EngineCI.MainDescriptorPoolSize.NumAccelStructDescriptors}
        },
        EngineCI.DynamicDescriptorPoolSize.MaxDescriptorSets,
        false // Pools can only be reset
    },
    m_MemoryMgr
    {
        "Global resource memory manager",
        *m_LogicalVkDevice,
        *m_PhysicalDevice,
        GetRawAllocator(),
        EngineCI.DeviceLocalMemoryPageSize,
        EngineCI.HostVisibleMemoryPageSize,
        EngineCI.DeviceLocalMemoryReserveSize,
        EngineCI.HostVisibleMemoryReserveSize
    },
    m_DynamicMemoryManager
    {
        GetRawAllocator(),
        *this,
        EngineCI.DynamicHeapSize,
        ~Uint64{0}
    },
    m_pDxCompiler{CreateDXCompiler(DXCompilerTarget::Vulkan, m_PhysicalDevice->GetVkVersion(), EngineCI.pDxCompilerPath)}
// clang-format on
{
    if (!m_LogicalVkDevice->GetEnabledExtFeatures().DynamicRendering.dynamicRendering)
    {
        m_FramebufferCache        = std::make_unique<FramebufferCache>(*this);
        m_ImplicitRenderPassCache = std::make_unique<RenderPassCache>(*this);
    }

    static_assert(sizeof(VulkanDescriptorPoolSize) == sizeof(Uint32) * 11, "Please add new descriptors to m_DescriptorSetAllocator and m_DynamicDescriptorPool constructors");

    const uint32_t vkVersion = m_PhysicalDevice->GetVkVersion();
    m_DeviceInfo.Type        = RENDER_DEVICE_TYPE_VULKAN;
    m_DeviceInfo.APIVersion  = Version{VK_API_VERSION_MAJOR(vkVersion), VK_API_VERSION_MINOR(vkVersion)};

    m_DeviceInfo.Features = VkFeaturesToDeviceFeatures(vkVersion,
                                                       m_LogicalVkDevice->GetEnabledFeatures(),
                                                       m_PhysicalDevice->GetProperties(),
                                                       m_LogicalVkDevice->GetEnabledExtFeatures(),
                                                       m_PhysicalDevice->GetExtProperties());

    m_DeviceInfo.MaxShaderVersion.HLSL   = {5, 1};
    m_DeviceInfo.MaxShaderVersion.GLSL   = {4, 6};
    m_DeviceInfo.MaxShaderVersion.GLESSL = {3, 2};

    // Note that Vulkan itself does not invert Y coordinate when transforming
    // normalized device Y to window space. However, we use negative viewport
    // height which achieves the same effect as in D3D, therefore we need to
    // invert y (see comments in DeviceContextVkImpl::CommitViewports() for details)
    m_DeviceInfo.NDC = NDCAttribs{0.0f, 1.0f, -0.5f};

    // Every queue family needs its own command pool.
    // Every queue needs its own query pool.
    m_QueryMgrs.reserve(CommandQueueCount);
    for (Uint32 q = 0; q < CommandQueueCount; ++q)
    {
        const HardwareQueueIndex QueueFamilyIndex{GetCommandQueue(SoftwareQueueIndex{q}).GetQueueFamilyIndex()};

        if (m_TransientCmdPoolMgrs.find(QueueFamilyIndex) == m_TransientCmdPoolMgrs.end())
        {
            m_TransientCmdPoolMgrs.emplace(
                QueueFamilyIndex,
                CommandPoolManager::CreateInfo{
                    //
                    GetLogicalDevice(),
                    "Transient command buffer pool manager",
                    QueueFamilyIndex,
                    VK_COMMAND_POOL_CREATE_TRANSIENT_BIT //
                });
        }

        m_QueryMgrs.emplace_back(std::make_unique<QueryManagerVk>(this, EngineCI.QueryPoolSizes, SoftwareQueueIndex{q}));
    }

    for (Uint32 fmt = 1; fmt < m_TextureFormatsInfo.size(); ++fmt)
        m_TextureFormatsInfo[fmt].Supported = true; // We will test every format on a specific hardware device

    InitShaderCompilationThreadPool(EngineCI.pAsyncShaderCompilationThreadPool, EngineCI.NumAsyncShaderCompilationThreads);
}